

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MockSupport_cTest.cpp
# Opt level: O2

Utest * __thiscall
TEST_MockSupport_c_FailWillNotCrashIfNotEnabled_TestShell::createTest
          (TEST_MockSupport_c_FailWillNotCrashIfNotEnabled_TestShell *this)

{
  Utest *this_00;
  
  this_00 = (Utest *)operator_new(8,
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTestExt/MockSupport_cTest.cpp"
                                  ,0x2b1);
  TEST_MockSupport_c_FailWillNotCrashIfNotEnabled_Test::
  TEST_MockSupport_c_FailWillNotCrashIfNotEnabled_Test
            ((TEST_MockSupport_c_FailWillNotCrashIfNotEnabled_Test *)this_00);
  return this_00;
}

Assistant:

TEST(MockSupport_c, FailWillNotCrashIfNotEnabled)
{
    cpputestHasCrashed = false;
    TestTestingFixture fixture;
    UtestShell::setCrashMethod(crashMethod);

    fixture.setTestFunction(failedCallToMockC);

    fixture.runAllTests();

    CHECK_FALSE(cpputestHasCrashed);
    LONGS_EQUAL(1, fixture.getFailureCount());

    UtestShell::resetCrashMethod();
}